

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextBuffer::appendfv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int iVar1;
  int new_capacity_00;
  undefined8 *in_RDX;
  __va_list_tag *in_RDI;
  int new_capacity;
  int needed_sz;
  int write_off;
  int len;
  va_list args_copy;
  uint new_size;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  char *buf;
  
  buf = (char *)*in_RDX;
  iVar1 = ImFormatStringV(buf,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_RDI);
  if (0 < iVar1) {
    if (in_RDI->gp_offset == 0) {
      new_size = 1;
    }
    else {
      new_size = in_RDI->gp_offset;
    }
    new_capacity_00 = new_size + iVar1;
    uVar2 = new_size;
    if ((int)in_RDI->fp_offset <= (int)(new_size + iVar1)) {
      in_stack_ffffffffffffffb8 = in_RDI->fp_offset << 1;
      ImVector<char>::reserve((ImVector<char> *)CONCAT44(iVar1,new_size),new_capacity_00);
    }
    ImVector<char>::resize((ImVector<char> *)in_RDI,new_size);
    ImVector<char>::operator[]((ImVector<char> *)in_RDI,new_size);
    ImFormatStringV(buf,CONCAT44(iVar1,uVar2),
                    (char *)CONCAT44(new_capacity_00,in_stack_ffffffffffffffb8),in_RDI);
  }
  return;
}

Assistant:

void ImGuiTextBuffer::appendfv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = ImFormatStringV(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
    {
        va_end(args_copy);
        return;
    }

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int new_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > new_capacity ? needed_sz : new_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off - 1], (size_t)len + 1, fmt, args_copy);
    va_end(args_copy);
}